

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O3

void __thiscall
Assimp::DXFImporter::GenerateMaterials(DXFImporter *this,aiScene *pScene,FileData *param_2)

{
  aiMaterial *this_00;
  aiMaterial **ppaVar1;
  char local_438 [20];
  aiString local_424;
  
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  memset(local_424.data + 0x10,0x1b,0x3f0);
  local_424.length = 0xf;
  builtin_strncpy(local_424.data,"DefaultMaterial",0x10);
  aiMaterial::AddProperty(this_00,&local_424,"?mat.name",0,0);
  builtin_strncpy(local_438,"fff?fff?fff?",0xd);
  local_438[0xd] = '\0';
  local_438[0xe] = -0x80;
  local_438[0xf] = '?';
  aiMaterial::AddBinaryProperty(this_00,local_438,0x10,"$clr.diffuse",0,0,aiPTI_Float);
  local_438[0] = '\0';
  local_438[1] = '\0';
  local_438[2] = -0x80;
  local_438[3] = '?';
  local_438[4] = '\0';
  local_438[5] = '\0';
  local_438[6] = -0x80;
  local_438[7] = '?';
  local_438[8] = '\0';
  local_438[9] = '\0';
  local_438[10] = -0x80;
  local_438[0xb] = '?';
  local_438[0xc] = '\0';
  local_438[0xd] = '\0';
  local_438[0xe] = -0x80;
  local_438[0xf] = '?';
  aiMaterial::AddBinaryProperty(this_00,local_438,0x10,"$clr.specular",0,0,aiPTI_Float);
  local_438[0] = -0x33;
  local_438[1] = -0x34;
  local_438[2] = 'L';
  local_438[3] = '=';
  local_438[4] = -0x33;
  local_438[5] = -0x34;
  local_438[6] = 'L';
  local_438[7] = '=';
  local_438[8] = -0x33;
  local_438[9] = -0x34;
  local_438[10] = 'L';
  local_438[0xb] = '=';
  local_438[0xc] = '\0';
  local_438[0xd] = '\0';
  local_438[0xe] = -0x80;
  local_438[0xf] = '?';
  aiMaterial::AddBinaryProperty(this_00,local_438,0x10,"$clr.ambient",0,0,aiPTI_Float);
  pScene->mNumMaterials = 1;
  ppaVar1 = (aiMaterial **)operator_new__(8);
  pScene->mMaterials = ppaVar1;
  *ppaVar1 = this_00;
  return;
}

Assistant:

void DXFImporter::GenerateMaterials(aiScene* pScene, DXF::FileData& /*output*/) {
    // generate an almost-white default material. Reason:
    // the default vertex color is GREY, so we are
    // already at Assimp's usual default color.
    // generate a default material
    aiMaterial* pcMat = new aiMaterial();
    aiString s;
    s.Set(AI_DEFAULT_MATERIAL_NAME);
    pcMat->AddProperty(&s, AI_MATKEY_NAME);

    aiColor4D clrDiffuse(0.9f,0.9f,0.9f,1.0f);
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_DIFFUSE);

    clrDiffuse = aiColor4D(1.0f,1.0f,1.0f,1.0f);
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_SPECULAR);

    clrDiffuse = aiColor4D(0.05f,0.05f,0.05f,1.0f);
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_AMBIENT);

    pScene->mNumMaterials = 1;
    pScene->mMaterials = new aiMaterial*[1];
    pScene->mMaterials[0] = pcMat;
}